

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O3

int __thiscall Individual::valueFunction(Individual *this,shared_ptr<Instance> *myInstance)

{
  int *piVar1;
  element_type *peVar2;
  int *piVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  bool bVar10;
  vector<int,_std::allocator<int>_> Cores;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  value_type_conflict1 local_14;
  
  local_14 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_30,
             (long)((myInstance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   numProcessors,&local_14,&local_31);
  piVar3 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 == piVar1) {
    iVar7 = 0;
  }
  else {
    peVar2 = (myInstance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    piVar8 = &((peVar2->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
               super__Vector_impl_data._M_start)->length;
    lVar5 = (long)(peVar2->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar8 >> 3;
    iVar7 = 0;
    lVar9 = lVar5;
    do {
      bVar10 = lVar9 == 0;
      lVar9 = lVar9 + -1;
      if (bVar10) {
        uVar4 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,lVar5);
        if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar4);
      }
      iVar6 = local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[*piVar3] + *piVar8;
      local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[*piVar3] = iVar6;
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
      iVar7 = iVar6;
      piVar3 = piVar3 + 1;
      piVar8 = piVar8 + 2;
    } while (piVar3 != piVar1);
  }
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int Individual::valueFunction(std::shared_ptr<Instance> myInstance){
	vector<int> Cores(myInstance->getNumProcessors(),0);
	int i = 0;
	int maxSoFar = 0;
	for(auto task : coresAsignedToTasks){
		Cores[task] += myInstance->getNthTaskLength(i);
		maxSoFar = max(maxSoFar,Cores[task]);
		i++;
	}
	return maxSoFar;
}